

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O1

int compare_files(char *fn,char *fn2)

{
  bool bVar1;
  int iVar2;
  uint __fd;
  uint __fd_00;
  int iVar3;
  size_t sVar4;
  ulong __n;
  ulong uVar5;
  ostream *poVar6;
  long lVar7;
  char *pcVar8;
  size_t toRead;
  size_t offset;
  stat sb2;
  stat sb1;
  uint8_t buf2 [512];
  uint8_t buf1 [512];
  long local_568;
  stat local_558;
  stat local_4c8;
  char local_438 [512];
  char local_238 [520];
  
  iVar2 = stat(fn,&local_4c8);
  if ((iVar2 == 0) && (iVar2 = stat(fn2,&local_558), iVar2 == 0)) {
    local_568 = local_4c8.st_size;
    if (local_4c8.st_size == local_558.st_size) {
      iVar2 = 0;
      __fd = open(fn,0);
      __fd_00 = open(fn2,0);
      if (-1 < (int)(__fd_00 | __fd)) {
        iVar2 = 0;
        do {
          if (local_568 == 0) break;
          __n = read(__fd,local_238,0x200);
          uVar5 = read(__fd_00,local_438,0x200);
          if ((long)(uVar5 | __n) < 0) {
            lVar7 = 0x1a;
            pcVar8 = "Unable to read from files ";
LAB_00110bfe:
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar8,lVar7);
            poVar6 = std::ostream::_M_insert<long>((long)&std::cerr);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
            poVar6 = std::ostream::_M_insert<long>((long)poVar6);
LAB_00110c30:
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
            std::ostream::put((char)poVar6);
            std::ostream::flush();
LAB_00110c5a:
            iVar2 = -1;
            bVar1 = false;
          }
          else {
            if (__n != uVar5) {
              lVar7 = 0x19;
              pcVar8 = "Mismatch in read amounts ";
              goto LAB_00110bfe;
            }
            if ((0 < (long)__n) && (iVar3 = bcmp(local_238,local_438,__n), iVar3 != 0)) {
              uVar5 = 0;
              do {
                if (local_238[uVar5] != local_438[uVar5]) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,"Files \'",7);
                  if (fn == (char *)0x0) {
                    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x19b870);
                  }
                  else {
                    sVar4 = strlen(fn);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,fn,sVar4);
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,"\' and \'",7);
                  if (fn2 == (char *)0x0) {
                    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x19b870);
                  }
                  else {
                    sVar4 = strlen(fn2);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,fn2,sVar4);
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,"\' differ in chunk starting at ",0x1e);
                  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
                  goto LAB_00110c30;
                }
                uVar5 = uVar5 + 1;
              } while (__n != uVar5);
              goto LAB_00110c5a;
            }
            local_568 = local_568 - __n;
            bVar1 = true;
          }
        } while (bVar1);
      }
      close(__fd);
      close(__fd_00);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"File sizes do not match: \'",0x1a);
      if (fn == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x19b870);
      }
      else {
        sVar4 = strlen(fn);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,fn,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\' ",2);
      poVar6 = std::ostream::_M_insert<long>((long)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," \'",2);
      if (fn2 == (char *)0x0) {
        std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
      }
      else {
        sVar4 = strlen(fn2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,fn2,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\' ",2);
      poVar6 = std::ostream::_M_insert<long>((long)poVar6);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      iVar2 = 1;
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Unable to stat \'",0x10);
    if (fn == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x19b870);
    }
    else {
      sVar4 = strlen(fn);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,fn,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\' and \'",7);
    if (fn2 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x19b870);
    }
    else {
      sVar4 = strlen(fn2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,fn2,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'p');
    std::ostream::put('p');
    std::ostream::flush();
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

static int compare_files (const char *fn, const char *fn2)
{
    struct stat sb1, sb2;
    if ( 0 == stat (fn, &sb1) && 0 == stat (fn2, &sb2))
    {
        if (sb1.st_size != sb2.st_size)
        {
            std::cerr << "File sizes do not match: '" << fn << "' " << sb1.st_size << " '" << fn2 << "' " << sb2.st_size << std::endl;
            return 1;
        }
        int fd1, fd2;
        int ret = 0;
        fd1 = open (fn, O_RDONLY);
        fd2 = open (fn2, O_RDONLY);
        if (fd1 >= 0 && fd2 >= 0)
        {
            uint8_t buf1[512], buf2[512];
            size_t toRead = sb1.st_size;
            size_t chunkReq = sizeof(buf1);
            size_t offset = 0;
            while (toRead > 0)
            {
                ssize_t nr1 = read (fd1, buf1, chunkReq);
                ssize_t nr2 = read (fd2, buf2, chunkReq);
                if (nr1 < 0 || nr2 < 0)
                {
                    std::cerr << "Unable to read from files " << nr1 << ", " << nr2 << std::endl;
                    ret = -1;
                    break;
                }
                if (nr1 != nr2)
                {
                    std::cerr << "Mismatch in read amounts " << nr1 << ", " << nr2 << std::endl;
                    ret = -1;
                    break;
                }
                if (nr1 > 0)
                {
                    if (memcmp (buf1, buf2, nr1) != 0)
                    {
                        for ( size_t b = 0; b < nr1; ++b )
                        {
                            if (buf1[b] != buf2[b])
                            {
                                std::cerr << "Files '" << fn << "' and '" << fn2 << "' differ in chunk starting at " << offset + b << std::endl;
                                break;
                            }
                        }
                        ret = -1;
                        break;
                    }
                }
                offset += nr1;
                toRead -= nr1;
            }
        }
        close (fd1);
        close (fd2);
        return ret;
    }
    else
    {
        std::cerr << "Unable to stat '" << fn << "' and '" << fn2 << "'" << std::endl;
    }
    return -1;
}